

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

int __thiscall basist::huffman_decoding_table::init(huffman_decoding_table *this,EVP_PKEY_CTX *ctx)

{
  int_vec *this_00;
  int16_vec *this_01;
  byte bVar1;
  uchar *__dest;
  int *piVar2;
  uint *puVar3;
  short *psVar4;
  uint in_ECX;
  uint uVar5;
  uint uVar6;
  void *in_RDX;
  undefined8 extraout_RDX;
  long lVar7;
  uint32_t i;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int j;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  uint32_t syms_using_codesize [32];
  uint auStack_b8 [34];
  
  iVar11 = (int)ctx;
  if (iVar11 == 0) {
    clear(this);
    iVar8 = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar14 = (ulong)ctx & 0xffffffff;
    basisu::vector<unsigned_char>::resize(&this->m_code_sizes,uVar14,false);
    __dest = basisu::vector<unsigned_char>::operator[](&this->m_code_sizes,0);
    memcpy(__dest,in_RDX,uVar14);
    uVar10 = 1 << ((byte)in_ECX & 0x1f);
    this_00 = &this->m_lookup;
    basisu::vector<int>::resize(this_00,0,false);
    basisu::vector<int>::resize(this_00,(ulong)uVar10,false);
    this_01 = &this->m_tree;
    basisu::vector<short>::resize(this_01,0,false);
    basisu::vector<short>::resize(this_01,(ulong)(uint)(iVar11 * 2),false);
    syms_using_codesize[0x1c] = 0;
    syms_using_codesize[0x1d] = 0;
    syms_using_codesize[0x1e] = 0;
    syms_using_codesize[0x1f] = 0;
    syms_using_codesize[0x18] = 0;
    syms_using_codesize[0x19] = 0;
    syms_using_codesize[0x1a] = 0;
    syms_using_codesize[0x1b] = 0;
    syms_using_codesize[0x14] = 0;
    syms_using_codesize[0x15] = 0;
    syms_using_codesize[0x16] = 0;
    syms_using_codesize[0x17] = 0;
    syms_using_codesize[0x10] = 0;
    syms_using_codesize[0x11] = 0;
    syms_using_codesize[0x12] = 0;
    syms_using_codesize[0x13] = 0;
    syms_using_codesize[0xc] = 0;
    syms_using_codesize[0xd] = 0;
    syms_using_codesize[0xe] = 0;
    syms_using_codesize[0xf] = 0;
    syms_using_codesize[8] = 0;
    syms_using_codesize[9] = 0;
    syms_using_codesize[10] = 0;
    syms_using_codesize[0xb] = 0;
    syms_using_codesize[4] = 0;
    syms_using_codesize[5] = 0;
    syms_using_codesize[6] = 0;
    syms_using_codesize[7] = 0;
    syms_using_codesize[0] = 0;
    syms_using_codesize[1] = 0;
    syms_using_codesize[2] = 0;
    syms_using_codesize[3] = 0;
    for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
      if (0x1f < (ulong)*(byte *)((long)in_RDX + uVar9)) {
        return 0;
      }
      syms_using_codesize[*(byte *)((long)in_RDX + uVar9)] =
           syms_using_codesize[*(byte *)((long)in_RDX + uVar9)] + 1;
    }
    auStack_b8[1] = 0;
    uVar16 = 0;
    uVar5 = 0;
    for (lVar7 = 2; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      uVar5 = uVar5 + syms_using_codesize[lVar7 + -1];
      uVar16 = (uVar16 + syms_using_codesize[lVar7 + -1]) * 2;
      auStack_b8[lVar7] = uVar16;
    }
    uVar9 = 0;
    iVar8 = 0;
    if (uVar5 < 2) {
      uVar14 = (ulong)ctx & 0xffffffff;
      if (iVar11 < 1) {
        uVar14 = uVar9;
      }
      iVar8 = -1;
      for (; uVar9 != uVar14; uVar9 = uVar9 + 1) {
        bVar1 = *(byte *)((long)in_RDX + uVar9);
        uVar15 = (ulong)bVar1;
        if (bVar1 != 0) {
          uVar13 = (uint)bVar1;
          uVar5 = auStack_b8[uVar15];
          auStack_b8[uVar15] = uVar5 + 1;
          uVar16 = 0;
          uVar6 = uVar13;
          while (bVar18 = uVar6 != 0, uVar6 = uVar6 - 1, bVar18) {
            uVar16 = (uVar5 & 1) + uVar16 * 2;
            uVar5 = uVar5 >> 1;
          }
          if (in_ECX < uVar13) {
            uVar12 = (ulong)(uVar16 & uVar10 - 1);
            piVar2 = basisu::vector<int>::operator[](this_00,uVar12);
            iVar17 = *piVar2;
            if (iVar17 == 0) {
              piVar2 = basisu::vector<int>::operator[](this_00,uVar12);
              if (*piVar2 != 0) {
                return 0;
              }
              piVar2 = basisu::vector<int>::operator[](this_00,uVar12);
              *piVar2 = iVar8;
              iVar17 = iVar8;
              iVar8 = iVar8 + -2;
            }
            if (-1 < iVar17) {
              return 0;
            }
            uVar16 = uVar16 >> ((byte)in_ECX - 1 & 0x1f);
            while( true ) {
              uVar16 = uVar16 >> 1;
              if ((int)uVar15 <= (int)(in_ECX + 1)) break;
              uVar5 = iVar17 - (uVar16 & 1);
              if (-1 < (int)uVar5) {
                return 0;
              }
              if ((int)(this->m_tree).m_size <= (int)~uVar5) {
                basisu::vector<short>::resize(this_01,(ulong)-uVar5,false);
              }
              uVar12 = (ulong)~uVar5;
              psVar4 = basisu::vector<short>::operator[](this_01,uVar12);
              if (*psVar4 == 0) {
                psVar4 = basisu::vector<short>::operator[](this_01,uVar12);
                *psVar4 = (short)iVar8;
                iVar17 = iVar8;
                iVar8 = iVar8 + -2;
              }
              else {
                psVar4 = basisu::vector<short>::operator[](this_01,uVar12);
                iVar17 = (int)*psVar4;
                if (-1 < *psVar4) {
                  return 0;
                }
              }
              uVar15 = (ulong)((int)uVar15 - 1);
            }
            uVar16 = (uVar16 & 1) - iVar17;
            if ((int)uVar16 < 1) {
              return 0;
            }
            if ((int)(this->m_tree).m_size < (int)uVar16) {
              basisu::vector<short>::resize(this_01,(ulong)uVar16,false);
            }
            psVar4 = basisu::vector<short>::operator[](this_01,(ulong)(uVar16 - 1));
            if (*psVar4 != 0) {
              return 0;
            }
            psVar4 = basisu::vector<short>::operator[](this_01,(ulong)(uVar16 - 1));
            *psVar4 = (short)uVar9;
          }
          else {
            for (; uVar16 < uVar10; uVar16 = uVar16 + (1 << (bVar1 & 0x1f))) {
              piVar2 = basisu::vector<int>::operator[](this_00,(ulong)uVar16);
              if (*piVar2 != 0) {
                return 0;
              }
              puVar3 = (uint *)basisu::vector<int>::operator[](this_00,(ulong)uVar16);
              *puVar3 = (uint)uVar9 | uVar13 << 0x10;
            }
          }
        }
      }
      iVar8 = (int)CONCAT71((int7)(uVar9 >> 8),(long)iVar11 <= (long)uVar9);
    }
  }
  return iVar8;
}

Assistant:

bool init(uint32_t total_syms, const uint8_t *pCode_sizes, uint32_t fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			if (!total_syms)
			{
				clear();
				return true;
			}

			m_code_sizes.resize(total_syms);
			memcpy(&m_code_sizes[0], pCode_sizes, total_syms);

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;

			m_lookup.resize(0);
			m_lookup.resize(huffman_fast_lookup_size);

			m_tree.resize(0);
			m_tree.resize(total_syms * 2);

			uint32_t syms_using_codesize[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			basisu::clear_obj(syms_using_codesize);
			for (uint32_t i = 0; i < total_syms; i++)
			{
				if (pCode_sizes[i] > basisu::cHuffmanMaxSupportedInternalCodeSize)
					return false;
				syms_using_codesize[pCode_sizes[i]]++;
			}

			uint32_t next_code[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			next_code[0] = next_code[1] = 0;

			uint32_t used_syms = 0, total = 0;
			for (uint32_t i = 1; i < basisu::cHuffmanMaxSupportedInternalCodeSize; i++)
			{
				used_syms += syms_using_codesize[i];
				next_code[i + 1] = (total = ((total + syms_using_codesize[i]) << 1));
			}

			if (((1U << basisu::cHuffmanMaxSupportedInternalCodeSize) != total) && (used_syms > 1U))
				return false;

			for (int tree_next = -1, sym_index = 0; sym_index < (int)total_syms; ++sym_index)
			{
				uint32_t rev_code = 0, l, cur_code, code_size = pCode_sizes[sym_index];
				if (!code_size)
					continue;

				cur_code = next_code[code_size]++;

				for (l = code_size; l > 0; l--, cur_code >>= 1)
					rev_code = (rev_code << 1) | (cur_code & 1);

				if (code_size <= fast_lookup_bits)
				{
					uint32_t k = (code_size << 16) | sym_index;
					while (rev_code < huffman_fast_lookup_size)
					{
						if (m_lookup[rev_code] != 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}

						m_lookup[rev_code] = k;
						rev_code += (1 << code_size);
					}
					continue;
				}

				int tree_cur;
				if (0 == (tree_cur = m_lookup[rev_code & (huffman_fast_lookup_size - 1)]))
				{
					const uint32_t idx = rev_code & (huffman_fast_lookup_size - 1);
					if (m_lookup[idx] != 0)
					{
						// Supplied codesizes can't create a valid prefix code.
						return false;
					}

					m_lookup[idx] = tree_next;
					tree_cur = tree_next;
					tree_next -= 2;
				}

				if (tree_cur >= 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				rev_code >>= (fast_lookup_bits - 1);

				for (int j = code_size; j > ((int)fast_lookup_bits + 1); j--)
				{
					tree_cur -= ((rev_code >>= 1) & 1);

					const int idx = -tree_cur - 1;
					if (idx < 0)
						return false;
					else if (idx >= (int)m_tree.size())
						m_tree.resize(idx + 1);
										
					if (!m_tree[idx])
					{
						m_tree[idx] = (int16_t)tree_next;
						tree_cur = tree_next;
						tree_next -= 2;
					}
					else
					{
						tree_cur = m_tree[idx];
						if (tree_cur >= 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}
					}
				}

				tree_cur -= ((rev_code >>= 1) & 1);

				const int idx = -tree_cur - 1;
				if (idx < 0)
					return false;
				else if (idx >= (int)m_tree.size())
					m_tree.resize(idx + 1);

				if (m_tree[idx] != 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				m_tree[idx] = (int16_t)sym_index;
			}

			return true;
		}